

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnMemoryCopyExpr
          (BinaryReaderIR *this,Index srcmemidx,Index destmemidx)

{
  char *pcVar1;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 aVar2;
  Result RVar3;
  Expr *pEVar4;
  Location loc_1;
  Location loc;
  _Head_base<0UL,_wabt::Expr_*,_false> local_198;
  Location local_190;
  Location local_170;
  Var local_150;
  Var local_108;
  Var local_c0;
  Var local_78;
  
  pcVar1 = this->filename_;
  aVar2.offset = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_170.field_1.field_0.last_column = 0;
  local_170.filename._M_len = strlen(pcVar1);
  local_170.filename._M_str = pcVar1;
  local_170.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)aVar2.offset;
  Var::Var(&local_108,srcmemidx,&local_170);
  pcVar1 = this->filename_;
  aVar2.offset = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_190.field_1.field_0.last_column = 0;
  local_190.filename._M_len = strlen(pcVar1);
  local_190.filename._M_str = pcVar1;
  local_190.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)aVar2.offset;
  Var::Var(&local_150,destmemidx,&local_190);
  pEVar4 = (Expr *)operator_new(0xd0);
  Var::Var(&local_78,&local_108);
  Var::Var(&local_c0,&local_150);
  *(undefined8 *)((long)&(pEVar4->loc).filename._M_str + 4) = 0;
  *(undefined8 *)((long)&(pEVar4->loc).field_1.field_1.offset + 4) = 0;
  (pEVar4->loc).filename._M_len = 0;
  (pEVar4->loc).filename._M_str = (char *)0x0;
  (pEVar4->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
  (pEVar4->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
  pEVar4->type_ = MemoryCopy;
  pEVar4->_vptr_Expr = (_func_int **)&PTR__MemoryBinaryExpr_0017aee8;
  Var::Var((Var *)(pEVar4 + 1),&local_78);
  Var::Var((Var *)&pEVar4[2].super_intrusive_list_base<wabt::Expr>,&local_c0);
  Var::~Var(&local_c0);
  Var::~Var(&local_78);
  local_198._M_head_impl = pEVar4;
  RVar3 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_198);
  if (local_198._M_head_impl != (Expr *)0x0) {
    (*(local_198._M_head_impl)->_vptr_Expr[1])();
  }
  Var::~Var(&local_150);
  Var::~Var(&local_108);
  return (Result)RVar3.enum_;
}

Assistant:

Result BinaryReaderIR::OnMemoryCopyExpr(Index srcmemidx, Index destmemidx) {
  return AppendExpr(std::make_unique<MemoryCopyExpr>(
      Var(srcmemidx, GetLocation()), Var(destmemidx, GetLocation())));
}